

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O0

void __thiscall
icu_63::SimpleTimeZone::getOffsetFromLocal
          (SimpleTimeZone *this,UDate date,int32_t nonExistingTimeOpt,int32_t duplicatedTimeOpt,
          int32_t *rawOffsetGMT,int32_t *savingsDST,UErrorCode *status)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int32_t iVar4;
  int32_t iVar5;
  UBool UVar6;
  int8_t iVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  UBool recalc;
  int32_t millis;
  double day;
  int32_t dow;
  int32_t dom;
  int32_t month;
  int32_t year;
  UErrorCode *status_local;
  int32_t *savingsDST_local;
  int32_t *rawOffsetGMT_local;
  int32_t duplicatedTimeOpt_local;
  int32_t nonExistingTimeOpt_local;
  UDate date_local;
  SimpleTimeZone *this_local;
  
  _month = status;
  status_local = savingsDST;
  savingsDST_local = rawOffsetGMT;
  rawOffsetGMT_local._0_4_ = duplicatedTimeOpt;
  rawOffsetGMT_local._4_4_ = nonExistingTimeOpt;
  _duplicatedTimeOpt_local = date;
  date_local = (UDate)this;
  UVar6 = ::U_FAILURE(*status);
  if (UVar6 == '\0') {
    iVar8 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[8])();
    *savingsDST_local = iVar8;
    dVar9 = uprv_floor_63(_duplicatedTimeOpt_local / 86400000.0);
    dVar10 = -dVar9 * 86400000.0 + _duplicatedTimeOpt_local;
    Grego::dayToFields(dVar9,&dom,&dow,(int32_t *)((long)&day + 4),(int32_t *)&day);
    iVar5 = dom;
    iVar4 = dow;
    uVar3 = day._4_4_;
    bVar2 = day._0_1_;
    iVar7 = Grego::monthLength(dom,dow);
    iVar8 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[5])
                      (this,1,(ulong)(uint)iVar5,(ulong)(uint)iVar4,(ulong)uVar3,(ulong)bVar2,
                       (int)dVar10,(int)iVar7,_month);
    *status_local = iVar8 - *savingsDST_local;
    UVar6 = ::U_FAILURE(*_month);
    if (UVar6 == '\0') {
      bVar1 = false;
      if (*status_local < U_ILLEGAL_ARGUMENT_ERROR) {
        if ((((uint)rawOffsetGMT_local & 3) == 3) ||
           ((((uint)rawOffsetGMT_local & 3) != 1 && (((uint)rawOffsetGMT_local & 0xc) == 4)))) {
          iVar8 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0xd])();
          _duplicatedTimeOpt_local = _duplicatedTimeOpt_local - (double)iVar8;
          bVar1 = true;
        }
      }
      else if (((rawOffsetGMT_local._4_4_ & 3) == 1) ||
              (((rawOffsetGMT_local._4_4_ & 3) != 3 && ((rawOffsetGMT_local._4_4_ & 0xc) != 0xc))))
      {
        iVar8 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0xd])();
        _duplicatedTimeOpt_local = _duplicatedTimeOpt_local - (double)iVar8;
        bVar1 = true;
      }
      if (bVar1) {
        dVar9 = uprv_floor_63(_duplicatedTimeOpt_local / 86400000.0);
        dVar10 = -dVar9 * 86400000.0 + _duplicatedTimeOpt_local;
        Grego::dayToFields(dVar9,&dom,&dow,(int32_t *)((long)&day + 4),(int32_t *)&day);
        iVar7 = Grego::monthLength(dom,dow);
        iVar8 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[5])
                          (this,1,(ulong)(uint)dom,(ulong)(uint)dow,(ulong)day._4_4_,
                           (ulong)day._0_1_,(int)dVar10,(int)iVar7,_month);
        *status_local = iVar8 - *savingsDST_local;
      }
    }
  }
  return;
}

Assistant:

void
SimpleTimeZone::getOffsetFromLocal(UDate date, int32_t nonExistingTimeOpt, int32_t duplicatedTimeOpt,
                                   int32_t& rawOffsetGMT, int32_t& savingsDST, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }

    rawOffsetGMT = getRawOffset();
    int32_t year, month, dom, dow;
    double day = uprv_floor(date / U_MILLIS_PER_DAY);
    int32_t millis = (int32_t) (date - day * U_MILLIS_PER_DAY);

    Grego::dayToFields(day, year, month, dom, dow);

    savingsDST = getOffset(GregorianCalendar::AD, year, month, dom,
                          (uint8_t) dow, millis,
                          Grego::monthLength(year, month),
                          status) - rawOffsetGMT;
    if (U_FAILURE(status)) {
        return;
    }

    UBool recalc = FALSE;

    // Now we need some adjustment
    if (savingsDST > 0) {
        if ((nonExistingTimeOpt & kStdDstMask) == kStandard
            || ((nonExistingTimeOpt & kStdDstMask) != kDaylight && (nonExistingTimeOpt & kFormerLatterMask) != kLatter)) {
            date -= getDSTSavings();
            recalc = TRUE;
        }
    } else {
        if ((duplicatedTimeOpt & kStdDstMask) == kDaylight
                || ((duplicatedTimeOpt & kStdDstMask) != kStandard && (duplicatedTimeOpt & kFormerLatterMask) == kFormer)) {
            date -= getDSTSavings();
            recalc = TRUE;
        }
    }
    if (recalc) {
        day = uprv_floor(date / U_MILLIS_PER_DAY);
        millis = (int32_t) (date - day * U_MILLIS_PER_DAY);
        Grego::dayToFields(day, year, month, dom, dow);
        savingsDST = getOffset(GregorianCalendar::AD, year, month, dom,
                          (uint8_t) dow, millis,
                          Grego::monthLength(year, month),
                          status) - rawOffsetGMT;
    }
}